

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256_t *hash,uchar *key,size_t keylen)

{
  undefined1 local_d0 [8];
  secp256k1_sha256_t sha256;
  uchar rkey [64];
  int n;
  size_t keylen_local;
  uchar *key_local;
  secp256k1_hmac_sha256_t *hash_local;
  
  if (keylen < 0x41) {
    memcpy(&sha256.bytes,key,keylen);
    memset((void *)((long)sha256.buf + keylen + 0x40),0,0x40 - keylen);
  }
  else {
    secp256k1_sha256_initialize((secp256k1_sha256_t *)local_d0);
    secp256k1_sha256_write((secp256k1_sha256_t *)local_d0,key,keylen);
    secp256k1_sha256_finalize((secp256k1_sha256_t *)local_d0,(uchar *)&sha256.bytes);
    memset(rkey + 0x18,0,0x20);
  }
  secp256k1_sha256_initialize(&hash->outer);
  rkey[0x3c] = '\0';
  rkey[0x3d] = '\0';
  rkey[0x3e] = '\0';
  rkey[0x3f] = '\0';
  for (; (int)rkey._60_4_ < 0x40; rkey._60_4_ = rkey._60_4_ + 1) {
    *(byte *)((long)sha256.buf + (long)(int)rkey._60_4_ + 0x40) =
         *(byte *)((long)sha256.buf + (long)(int)rkey._60_4_ + 0x40) ^ 0x5c;
  }
  secp256k1_sha256_write(&hash->outer,(uchar *)&sha256.bytes,0x40);
  secp256k1_sha256_initialize(&hash->inner);
  rkey[0x3c] = '\0';
  rkey[0x3d] = '\0';
  rkey[0x3e] = '\0';
  rkey[0x3f] = '\0';
  for (; (int)rkey._60_4_ < 0x40; rkey._60_4_ = rkey._60_4_ + 1) {
    *(byte *)((long)sha256.buf + (long)(int)rkey._60_4_ + 0x40) =
         *(byte *)((long)sha256.buf + (long)(int)rkey._60_4_ + 0x40) ^ 0x6a;
  }
  secp256k1_sha256_write(&hash->inner,(uchar *)&sha256.bytes,0x40);
  memset(&sha256.bytes,0,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256_t *hash, const unsigned char *key, size_t keylen) {
    int n;
    unsigned char rkey[64];
    if (keylen <= 64) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 64 - keylen);
    } else {
        secp256k1_sha256_t sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < 64; n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, 64);

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < 64; n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, 64);
    memset(rkey, 0, 64);
}